

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_lengthi<char32_t,char32_t>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  wchar32 wVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  wchar32 *pwVar5;
  ulong uVar6;
  wchar32 *pwVar7;
  ulong uVar8;
  size_t sVar9;
  
  pwVar7 = in_string._M_str;
  uVar6 = in_string._M_len;
  pwVar5 = in_prefix._M_str;
  uVar8 = in_prefix._M_len;
  if (uVar6 < uVar8) {
    return 0;
  }
  sVar9 = 0;
  do {
    if ((uVar6 == 0) || (uVar8 == 0)) {
      if (uVar8 != 0) {
        return 0;
      }
      return sVar9;
    }
    wVar1 = *pwVar5;
    if (*pwVar7 == wVar1) {
LAB_0027b82d:
      pwVar7 = pwVar7 + 1;
      uVar6 = uVar6 - 1;
      pwVar5 = pwVar5 + 1;
      uVar8 = uVar8 - 1;
      sVar9 = sVar9 + 1;
      bVar2 = true;
    }
    else {
      iVar3 = jessilib::fold(*pwVar7);
      iVar4 = jessilib::fold(wVar1);
      if (iVar3 == iVar4) goto LAB_0027b82d;
      bVar2 = false;
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}